

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ClassDeclarationSyntax * __thiscall
slang::parsing::Parser::parseClassDeclaration
          (Parser *this,AttrList attributes,Token virtualOrInterface)

{
  LanguageVersion LVar1;
  SyntaxNode *pSVar2;
  Token name;
  Token semi_00;
  Token virtualOrInterface_00;
  Info *pIVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  SourceLocation SVar8;
  Diagnostic *pDVar9;
  NameSyntax *baseName;
  DefaultExtendsClauseArgSyntax *defaultedArg;
  ArgumentListSyntax *arguments;
  ExtendsClauseSyntax *extendsClause;
  ImplementsClauseSyntax *implementsClause;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  ClassDeclarationSyntax *pCVar10;
  ulong uVar11;
  char *pcVar12;
  undefined8 uVar13;
  BumpAllocator *dst;
  size_t sVar14;
  byte bVar15;
  TokenKind keywordKind;
  bool bVar16;
  Token classKeyword;
  string_view arg;
  Token TVar17;
  Token TVar18;
  Token TVar19;
  SourceRange SVar20;
  string_view sVar21;
  Token defaultKeyword;
  ClassSpecifierSyntax *local_168;
  MemberSyntax *member;
  Info *local_158;
  undefined8 local_150;
  Info *local_148;
  undefined8 local_140;
  ParameterPortListSyntax *local_138;
  pointer local_130;
  size_t local_128;
  Info *local_120;
  undefined8 local_118;
  ulong local_110;
  Info *local_108;
  Token endClass;
  SyntaxList<slang::syntax::MemberSyntax> local_f0;
  undefined8 local_b8;
  Info *pIStack_b0;
  Token local_a8;
  Token semi;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  
  local_108 = virtualOrInterface.info;
  uVar11 = virtualOrInterface._0_8_;
  local_128 = (size_t)attributes._M_extent._M_extent_value;
  local_130 = attributes._M_ptr;
  TVar17 = ParserBase::consume(&this->super_ParserBase);
  local_120 = TVar17.info;
  local_118 = TVar17._0_8_;
  local_110 = uVar11;
  if ((uVar11 & 0xffff) == 200) {
LAB_001c9143:
    local_168 = (ClassSpecifierSyntax *)0x0;
  }
  else {
    TVar17 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar17.kind == StaticKeyword) || (TVar17.kind == AutomaticKeyword)) {
      uVar13 = 0x100410005;
      if ((int)(this->parseOptions).languageVersion < 1) {
        uVar13 = 0;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (_Optional_base<slang::DiagCode,_true,_true>)SUB86(uVar13,0));
      ParserBase::peek(&this->super_ParserBase);
    }
    local_168 = parseClassSpecifier(this);
    TVar17.info = local_120;
    TVar17.kind = (undefined2)local_118;
    TVar17._2_1_ = local_118._2_1_;
    TVar17.numFlags.raw = local_118._3_1_;
    TVar17.rawLen = local_118._4_4_;
    if (local_168 == (ClassSpecifierSyntax *)0x0) goto LAB_001c9143;
    if (((local_168->keyword).info != (Info *)0x0) && ((local_168->keyword).kind != FinalKeyword)) {
      SVar8 = Token::location(&local_168->keyword);
      pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x550005,SVar8);
      sVar21._M_str = "final";
      sVar21._M_len = 5;
      Diagnostic::operator<<(pDVar9,sVar21);
      TVar17.info = local_120;
      TVar17.kind = (undefined2)local_118;
      TVar17._2_1_ = local_118._2_1_;
      TVar17.numFlags.raw = local_118._3_1_;
      TVar17.rawLen = local_118._4_4_;
    }
  }
  local_120 = TVar17.info;
  local_118 = TVar17._0_8_;
  TVar17 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_148 = TVar17.info;
  local_140 = TVar17._0_8_;
  local_138 = parseParameterPortList(this);
  Token::Token(&semi);
  iVar7 = (int)(uVar11 & 0xffff);
  if (iVar7 == 200) {
    extendsClause = (ExtendsClauseSyntax *)0x0;
    keywordKind = ExtendsKeyword;
    goto LAB_001c92f6;
  }
  bVar5 = ParserBase::peek(&this->super_ParserBase,ExtendsKeyword);
  keywordKind = ImplementsKeyword;
  if (!bVar5) {
    extendsClause = (ExtendsClauseSyntax *)0x0;
    goto LAB_001c92f6;
  }
  TVar17 = ParserBase::consume(&this->super_ParserBase);
  baseName = parseName(this);
  bVar5 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar5) {
    TVar18 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar18.kind == DefaultKeyword) {
      TVar18 = ParserBase::consume(&this->super_ParserBase);
      TVar19 = ParserBase::consume(&this->super_ParserBase);
      local_158 = TVar19.info;
      local_150 = TVar19._0_8_;
      local_a8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      defaultKeyword.info = local_158;
      defaultKeyword.kind = (undefined2)local_150;
      defaultKeyword._2_1_ = local_150._2_1_;
      defaultKeyword.numFlags.raw = local_150._3_1_;
      defaultKeyword.rawLen = local_150._4_4_;
      defaultedArg = slang::syntax::SyntaxFactory::defaultExtendsClauseArg
                               (&this->factory,TVar18,defaultKeyword,local_a8);
      if ((int)(this->parseOptions).languageVersion < 1) {
        SVar20 = slang::syntax::SyntaxNode::sourceRange(&defaultedArg->super_SyntaxNode);
        pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x20001,SVar20);
        LVar1 = (this->parseOptions).languageVersion;
        sVar14 = 9;
        if (LVar1 == Default) {
          pcVar12 = "1800-2017";
        }
        else if (LVar1 == v1800_2023) {
          pcVar12 = "1800-2023";
        }
        else {
          pcVar12 = "";
          sVar14 = 0;
        }
        arg._M_str = pcVar12;
        arg._M_len = sVar14;
        Diagnostic::operator<<(pDVar9,arg);
      }
      goto LAB_001c92c9;
    }
    arguments = parseArgumentList(this);
    defaultedArg = (DefaultExtendsClauseArgSyntax *)0x0;
  }
  else {
    defaultedArg = (DefaultExtendsClauseArgSyntax *)0x0;
LAB_001c92c9:
    arguments = (ArgumentListSyntax *)0x0;
  }
  extendsClause =
       slang::syntax::SyntaxFactory::extendsClause
                 (&this->factory,TVar17,baseName,arguments,defaultedArg);
LAB_001c92f6:
  implementsClause = parseImplementsClause(this,keywordKind,&semi);
  Token::Token(&endClass);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
  bVar5 = false;
  while( true ) {
    TVar17 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar17.kind == EndOfFile) || ((TVar17._0_4_ & 0xffff) == 0x91)) break;
    member = parseClassMember(this,iVar7 == 200,extendsClause != (ExtendsClauseSyntax *)0x0);
    bVar16 = member == (MemberSyntax *)0x0;
    if (bVar16) {
      bVar6 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar17.kind);
      if (bVar6) {
        local_f0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        SVar20 = Token::range((Token *)&local_f0);
        pDVar9 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,SVar20);
        local_f0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        sVar21 = Token::valueText((Token *)&local_f0);
        Diagnostic::operator<<(pDVar9,sVar21);
        bVar15 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar15 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar8 = Token::location(&(this->super_ParserBase).lastPoppedDelims.first);
          Diagnostic::addNote(pDVar9,(DiagCode)0xc10005,SVar8);
          SVar8 = Token::location(&(this->super_ParserBase).lastPoppedDelims.second);
          Diagnostic::addNote(pDVar9,(DiagCode)0xc00005,SVar8);
          bVar15 = 0;
        }
      }
      else {
        bVar15 = ~bVar5 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar15 << 0x20 | 0x450005));
      bVar5 = bVar16;
    }
    else {
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
      pSVar2 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (member->super_SyntaxNode).previewNode = pSVar2;
      bVar5 = bVar16;
    }
  }
  endClass = ParserBase::expect(&this->super_ParserBase,EndClassKeyword);
  dst = (this->super_ParserBase).alloc;
  iVar7 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                     (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)endClass.info);
  SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
            (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)dst);
  endBlock = parseNamedBlockClause(this);
  uVar13 = local_140;
  pIVar3 = local_148;
  TVar18.info = local_148;
  TVar18.kind = (undefined2)local_140;
  TVar18._2_1_ = local_140._2_1_;
  TVar18.numFlags.raw = local_140._3_1_;
  TVar18.rawLen = local_140._4_4_;
  checkBlockNames(this,TVar18,endBlock);
  uVar4 = local_140;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len =
       CONCAT44(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._4_4_,1);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
  members.stackBase[0] = (undefined1)local_128;
  members.stackBase[1] = local_128._1_1_;
  members.stackBase[2] = local_128._2_1_;
  members.stackBase[3] = local_128._3_1_;
  members.stackBase[4] = local_128._4_1_;
  members.stackBase[5] = local_128._5_1_;
  members.stackBase[6] = local_128._6_1_;
  members.stackBase[7] = local_128._7_1_;
  members.stackBase._8_8_ = local_130;
  members.stackBase[0x10] = (undefined1)local_128;
  members.stackBase[0x11] = local_128._1_1_;
  members.stackBase[0x12] = local_128._2_1_;
  members.stackBase[0x13] = local_128._3_1_;
  members.stackBase[0x14] = local_128._4_1_;
  members.stackBase[0x15] = local_128._5_1_;
  members.stackBase[0x16] = local_128._6_1_;
  members.stackBase[0x17] = local_128._7_1_;
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
       (pointer)&PTR_getChild_005e8088;
  local_b8 = uVar13;
  pIStack_b0 = pIVar3;
  local_f0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_f0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_f0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_f0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e86f8;
  virtualOrInterface_00.info = local_108;
  virtualOrInterface_00.kind = (undefined2)local_110;
  virtualOrInterface_00._2_1_ = local_110._2_1_;
  virtualOrInterface_00.numFlags.raw = local_110._3_1_;
  virtualOrInterface_00.rawLen = local_110._4_4_;
  name.info = pIVar3;
  local_140._0_2_ = (undefined2)uVar13;
  local_140._2_1_ = SUB81(uVar13,2);
  local_140._3_1_ = SUB81(uVar13,3);
  local_140._4_4_ = SUB84(uVar13,4);
  name.kind = (undefined2)local_140;
  name._2_1_ = local_140._2_1_;
  name.numFlags.raw = local_140._3_1_;
  name.rawLen = local_140._4_4_;
  semi_00.info = semi.info;
  semi_00.kind = semi.kind;
  semi_00._2_1_ = semi._2_1_;
  semi_00.numFlags.raw = semi.numFlags.raw;
  semi_00.rawLen = semi.rawLen;
  classKeyword.info = local_120;
  classKeyword.kind = (undefined2)local_118;
  classKeyword._2_1_ = local_118._2_1_;
  classKeyword.numFlags.raw = local_118._3_1_;
  classKeyword.rawLen = local_118._4_4_;
  local_140 = uVar4;
  local_f0.super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar7);
  pCVar10 = slang::syntax::SyntaxFactory::classDeclaration
                      (&this->factory,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&members
                       ,virtualOrInterface_00,classKeyword,local_168,name,local_138,extendsClause,
                       implementsClause,semi_00,&local_f0,endClass,endBlock);
  members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ = (pointer)pCVar10;
  std::
  vector<slang::syntax::ClassDeclarationSyntax_const*,std::allocator<slang::syntax::ClassDeclarationSyntax_const*>>
  ::emplace_back<slang::syntax::ClassDeclarationSyntax_const*>
            ((vector<slang::syntax::ClassDeclarationSyntax_const*,std::allocator<slang::syntax::ClassDeclarationSyntax_const*>>
              *)&(this->meta).classDecls,(ClassDeclarationSyntax **)&members);
  return pCVar10;
}

Assistant:

ClassDeclarationSyntax& Parser::parseClassDeclaration(AttrList attributes,
                                                      Token virtualOrInterface) {
    auto classKeyword = consume();

    const bool isIfaceClass = virtualOrInterface.kind == TokenKind::InterfaceKeyword;
    ClassSpecifierSyntax* finalSpecifier = nullptr;
    if (!isIfaceClass) {
        auto next = peek();
        if (next.kind == TokenKind::StaticKeyword || next.kind == TokenKind::AutomaticKeyword) {
            // This was allowed in 1800-2017 but did nothing, so silently skip it.
            // It was removed in 1800-2023 so issue an error.
            if (parseOptions.languageVersion < LanguageVersion::v1800_2023)
                skipToken({});
            else
                skipToken(diag::ExpectedIdentifier);
            next = peek();
        }

        finalSpecifier = parseClassSpecifier();
        if (finalSpecifier && finalSpecifier->keyword &&
            finalSpecifier->keyword.kind != TokenKind::FinalKeyword) {
            addDiag(diag::ExpectedToken, finalSpecifier->keyword.location()) << "final"sv;
        }
    }

    auto name = expect(TokenKind::Identifier);
    auto parameterList = parseParameterPortList();

    Token semi;
    ExtendsClauseSyntax* extendsClause = nullptr;
    ImplementsClauseSyntax* implementsClause = nullptr;

    // interface classes treat "extends" as the implements list
    if (isIfaceClass) {
        implementsClause = parseImplementsClause(TokenKind::ExtendsKeyword, semi);
    }
    else {
        if (peek(TokenKind::ExtendsKeyword)) {
            auto extends = consume();
            auto& baseName = parseName();

            ArgumentListSyntax* arguments = nullptr;
            DefaultExtendsClauseArgSyntax* defaultedArg = nullptr;
            if (peek(TokenKind::OpenParenthesis)) {
                if (peek(1).kind == TokenKind::DefaultKeyword) {
                    auto openParen = consume();
                    auto defaultKeyword = consume();
                    defaultedArg = &factory.defaultExtendsClauseArg(
                        openParen, defaultKeyword, expect(TokenKind::CloseParenthesis));

                    if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
                        addDiag(diag::WrongLanguageVersion, defaultedArg->sourceRange())
                            << toString(parseOptions.languageVersion);
                    }
                }
                else {
                    arguments = &parseArgumentList();
                }
            }

            extendsClause = &factory.extendsClause(extends, baseName, arguments, defaultedArg);
        }
        implementsClause = parseImplementsClause(TokenKind::ImplementsKeyword, semi);
    }

    Token endClass;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndClassKeyword, endClass, SyntaxKind::ClassDeclaration,
        [this, isIfaceClass, extendsClause](SyntaxKind, bool&) {
            return parseClassMember(isIfaceClass, extendsClause != nullptr);
        });

    auto endBlockName = parseNamedBlockClause();
    checkBlockNames(name, endBlockName);

    auto& result = factory.classDeclaration(attributes, virtualOrInterface, classKeyword,
                                            finalSpecifier, name, parameterList, extendsClause,
                                            implementsClause, semi, members, endClass,
                                            endBlockName);
    meta.classDecls.push_back(&result);
    return result;
}